

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

QVariant * __thiscall QGraphicsScene::inputMethodQuery(QGraphicsScene *this,InputMethodQuery query)

{
  int iVar1;
  QGraphicsScenePrivate *pQVar2;
  QRect *pQVar3;
  QPoint *pQVar4;
  uint in_EDX;
  QRectF *pQVar5;
  QPointF *pQVar6;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  QGraphicsScenePrivate *d;
  QVariant *value;
  QTransform matrix;
  undefined8 in_stack_fffffffffffffe28;
  GraphicsItemFlag other;
  QGraphicsItem *in_stack_fffffffffffffe30;
  QVariant *in_stack_fffffffffffffe38;
  QGraphicsItem *in_stack_fffffffffffffe40;
  bool local_199;
  undefined8 local_130 [6];
  undefined1 local_100 [8];
  QVariant *local_f8;
  QVariant *local_f0;
  QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4> local_e0;
  QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4> local_dc;
  QVariant local_d8;
  QVariant local_b8;
  QVariant local_98;
  QVariant local_78;
  undefined1 local_58 [80];
  long local_8;
  
  other = (GraphicsItemFlag)((ulong)in_stack_fffffffffffffe28 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QGraphicsScene *)0x9cd7ca);
  local_199 = true;
  if (pQVar2->focusItem != (QGraphicsItem *)0x0) {
    local_e0.super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i =
         (QFlagsStorage<QGraphicsItem::GraphicsItemFlag>)
         QGraphicsItem::flags(in_stack_fffffffffffffe30);
    local_dc.super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i =
         (QFlagsStorage<QGraphicsItem::GraphicsItemFlag>)
         QFlags<QGraphicsItem::GraphicsItemFlag>::operator&
                   ((QFlags<QGraphicsItem::GraphicsItemFlag> *)in_stack_fffffffffffffe30,other);
    local_199 = QFlags<QGraphicsItem::GraphicsItemFlag>::operator!
                          ((QFlags<QGraphicsItem::GraphicsItemFlag> *)&local_dc);
  }
  if (local_199 == false) {
    memcpy(local_58,&DAT_00b44d18,0x50);
    QGraphicsItem::sceneTransform(in_stack_fffffffffffffe40);
    (in_RDI->d).data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)((long)&(in_RDI->d).data + 8) = &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)((long)&(in_RDI->d).data + 0x10) = &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&(in_RDI->d).field_0x18 = &DAT_aaaaaaaaaaaaaaaa;
    (*pQVar2->focusItem->_vptr_QGraphicsItem[0x20])(in_RDI,pQVar2->focusItem,(ulong)in_EDX);
    iVar1 = ::QVariant::userType((QVariant *)0x9cd8c9);
    if (iVar1 == 0x14) {
      ::QVariant::toRectF();
      pQVar5 = (QRectF *)local_58;
      QTransform::mapRect((QRectF *)local_100);
      ::QVariant::QVariant(&local_78,pQVar5);
      ::QVariant::operator=(local_f0,local_f8);
      ::QVariant::~QVariant(&local_78);
    }
    else {
      iVar1 = ::QVariant::userType((QVariant *)0x9cd966);
      if (iVar1 == 0x1a) {
        local_130[0] = ::QVariant::toPointF();
        pQVar6 = (QPointF *)local_130;
        QTransform::map((QPointF *)local_58);
        ::QVariant::QVariant(&local_98,pQVar6);
        ::QVariant::operator=(in_stack_fffffffffffffe38,(QVariant *)in_stack_fffffffffffffe30);
        ::QVariant::~QVariant(&local_98);
      }
      else {
        iVar1 = ::QVariant::userType((QVariant *)0x9cd9ef);
        if (iVar1 == 0x13) {
          ::QVariant::toRect();
          pQVar3 = (QRect *)QTransform::mapRect((QRect *)local_58);
          ::QVariant::QVariant(&local_b8,pQVar3);
          ::QVariant::operator=(in_stack_fffffffffffffe38,(QVariant *)in_stack_fffffffffffffe30);
          ::QVariant::~QVariant(&local_b8);
        }
        else {
          iVar1 = ::QVariant::userType((QVariant *)0x9cda6f);
          if (iVar1 == 0x19) {
            ::QVariant::toPoint();
            pQVar4 = (QPoint *)QTransform::map((QPoint *)local_58);
            ::QVariant::QVariant(&local_d8,pQVar4);
            ::QVariant::operator=(in_stack_fffffffffffffe38,(QVariant *)in_stack_fffffffffffffe30);
            ::QVariant::~QVariant(&local_d8);
          }
        }
      }
    }
  }
  else {
    ::QVariant::QVariant((QVariant *)0x9cd83a);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QGraphicsScene::inputMethodQuery(Qt::InputMethodQuery query) const
{
    Q_D(const QGraphicsScene);
    if (!d->focusItem || !(d->focusItem->flags() & QGraphicsItem::ItemAcceptsInputMethod))
        return QVariant();
    const QTransform matrix = d->focusItem->sceneTransform();
    QVariant value = d->focusItem->inputMethodQuery(query);
    if (value.userType() == QMetaType::QRectF)
        value = matrix.mapRect(value.toRectF());
    else if (value.userType() == QMetaType::QPointF)
        value = matrix.map(value.toPointF());
    else if (value.userType() == QMetaType::QRect)
        value = matrix.mapRect(value.toRect());
    else if (value.userType() == QMetaType::QPoint)
        value = matrix.map(value.toPoint());
    return value;
}